

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonAST.hpp
# Opt level: O3

void __thiscall antlr::CommonAST::initialize(CommonAST *this,RefAST *t)

{
  uint uVar1;
  long *local_30 [2];
  long local_20 [2];
  
  uVar1 = (*t->ref->ptr->_vptr_AST[0x10])();
  (*(this->super_BaseAST).super_AST._vptr_AST[0x17])(this,(ulong)uVar1);
  (*t->ref->ptr->_vptr_AST[0xf])(local_30);
  (*(this->super_BaseAST).super_AST._vptr_AST[0x16])(this,local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

virtual void initialize( RefAST t )
	{
		setType(t->getType());
		setText(t->getText());
	}